

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::VectorVarTest_DISABLED_Speed_Test::TestBody
          (VectorVarTest_DISABLED_Speed_Test *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int64_t iVar4;
  ulong uVar5;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int simd_sum_time;
  int c_sum_time;
  size_t i_1;
  aom_usec_timer simd_timer_;
  int sum_simd_var;
  int simd_var;
  size_t i;
  aom_usec_timer c_timer_;
  int c_var;
  int sum_c_var;
  int numIter;
  char (*in_stack_ffffffffffffff08) [18];
  VectorVarTestBase *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  Message *in_stack_ffffffffffffff28;
  int line;
  Type in_stack_ffffffffffffff3c;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_b8 [3];
  AssertionResult local_88;
  AssertHelper *this_01;
  aom_usec_timer local_68;
  int local_48;
  int local_44;
  ulong local_40;
  aom_usec_timer local_38;
  int local_14;
  int local_10;
  undefined4 local_c;
  
  VectorVarTestBase::FillRandom(in_stack_ffffffffffffff10);
  local_c = 5000000;
  printf("Width = %d number of iteration is %d \n",(ulong)*(uint *)(in_RDI + 0x10),5000000);
  local_10 = 0;
  local_14 = 0;
  ::aom_usec_timer_start((aom_usec_timer *)0xa4a85a);
  for (local_40 = 0; local_40 < 5000000; local_40 = local_40 + 1) {
    local_14 = VectorVarTest::calcVarC((VectorVarTest *)0xa4a87e);
    local_10 = local_14 + local_10;
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0xa4a8bd);
  local_44 = 0;
  local_48 = 0;
  ::aom_usec_timer_start((aom_usec_timer *)0xa4a8e0);
  for (this_01 = (AssertHelper *)0x0; this_01 < (AssertHelper *)0x4c4b40;
      this_01 = (AssertHelper *)((long)&this_01->data_ + 1)) {
    local_44 = VectorVarTest::calcVarSIMD((VectorVarTest *)0xa4a904);
    local_48 = local_44 + local_48;
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0xa4a943);
  iVar4 = ::aom_usec_timer_elapsed(&local_38);
  uVar2 = (uint)iVar4;
  uVar5 = ::aom_usec_timer_elapsed(&local_68);
  iVar3 = (int)uVar5;
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(int)uVar2 / (float)iVar3),(ulong)uVar2,uVar5 & 0xffffffff);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (int *)in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff28 =
         testing::Message::operator<<
                   ((Message *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff20 =
         testing::AssertionResult::failure_message((AssertionResult *)0xa4aa0c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_RDI,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(this_01,(Message *)CONCAT44(uVar2,iVar3));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0xa4aa5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa4aaaa);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (int *)in_stack_ffffffffffffff10);
  line = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    testing::Message::operator<<((Message *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xa4ab24)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_RDI,line,
               in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(this_01,(Message *)CONCAT44(uVar2,iVar3));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xa4ab72);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa4abc2);
  return;
}

Assistant:

TEST_P(VectorVarTest, DISABLED_Speed) {
  FillRandom();
  const int numIter = 5000000;
  printf("Width = %d number of iteration is %d \n", width, numIter);

  int sum_c_var = 0;
  int c_var = 0;

  aom_usec_timer c_timer_;
  aom_usec_timer_start(&c_timer_);
  for (size_t i = 0; i < numIter; i++) {
    c_var = calcVarC();
    sum_c_var += c_var;
  }
  aom_usec_timer_mark(&c_timer_);

  int simd_var = 0;
  int sum_simd_var = 0;
  aom_usec_timer simd_timer_;
  aom_usec_timer_start(&simd_timer_);
  for (size_t i = 0; i < numIter; i++) {
    simd_var = calcVarSIMD();
    sum_simd_var += simd_var;
  }
  aom_usec_timer_mark(&simd_timer_);

  const int c_sum_time = static_cast<int>(aom_usec_timer_elapsed(&c_timer_));
  const int simd_sum_time =
      static_cast<int>(aom_usec_timer_elapsed(&simd_timer_));

  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n", c_sum_time,
         simd_sum_time,
         (static_cast<float>(c_sum_time) / static_cast<float>(simd_sum_time)));

  EXPECT_EQ(c_var, simd_var) << "Output mismatch \n";
  EXPECT_EQ(sum_c_var, sum_simd_var) << "Output mismatch \n";
}